

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powell.hpp
# Opt level: O3

vec3f optimize(vec3f initial,function<double_(vec3f)> *loss)

{
  double dVar1;
  bool bVar2;
  data_t dVar3;
  pointer pvVar4;
  pointer pdVar5;
  iterator iVar6;
  long lVar7;
  pointer pvVar8;
  float fVar9;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar10;
  float fVar11;
  float fVar12;
  vec3f vVar13;
  initializer_list<vec3f> __l;
  vec3f d;
  vector<double,_std::allocator<double>_> improvement;
  vector<vec3f,_std::allocator<vec3f>_> dir;
  float local_114;
  double local_110;
  data_t local_108;
  double local_100;
  double local_f8;
  float local_f0;
  undefined8 local_e8;
  float local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  vector<double,_std::allocator<double>_> local_c8;
  undefined8 uStack_b0;
  undefined4 local_a8;
  undefined1 local_98 [16];
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  double local_68;
  vector<vec3f,_std::allocator<vec3f>_> local_60;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_114 = initial.z;
  local_98._8_4_ = in_XMM0_Dc;
  local_98._0_8_ = initial._0_8_;
  local_98._12_4_ = in_XMM0_Dd;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3f800000;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3f800000;
  uStack_b0 = 0;
  local_a8 = 0x3f800000;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_c8;
  std::vector<vec3f,_std::allocator<vec3f>_>::vector(&local_60,__l,(allocator_type *)&local_f8);
  do {
    local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (double *)0x0;
    local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (double *)0x0;
    local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    local_110 = local_98._0_8_;
    local_108 = local_114;
    local_f0 = local_114;
    local_f8 = local_110;
    if ((loss->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    local_100 = (*loss->_M_invoker)((_Any_data *)loss,(vec3f *)&local_f8);
    pvVar4 = local_60.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pvVar8 = local_60.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                  super__Vector_impl_data._M_start; pvVar8 != pvVar4; pvVar8 = pvVar8 + 1) {
      local_e0 = pvVar8->z;
      local_e8._0_4_ = pvVar8->x;
      local_e8._4_4_ = pvVar8->y;
      local_88._M_unused._M_object = (void *)0x0;
      local_88._8_8_ = 0;
      local_78 = (code *)0x0;
      pcStack_70 = (code *)0x0;
      local_88._M_unused._M_object = operator_new(0x18);
      *(function<double_(vec3f)> **)local_88._M_unused._0_8_ = loss;
      *(double **)((long)local_88._M_unused._0_8_ + 8) = &local_110;
      *(undefined8 **)((long)local_88._M_unused._0_8_ + 0x10) = &local_e8;
      pcStack_70 = std::
                   _Function_handler<double_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/powell.hpp:65:27)>
                   ::_M_invoke;
      local_78 = std::
                 _Function_handler<double_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/powell.hpp:65:27)>
                 ::_M_manager;
      local_d8 = optimize(0.0,(function<double_(double)> *)&local_88);
      if (local_78 != (code *)0x0) {
        (*local_78)(&local_88,&local_88,__destroy_functor);
      }
      fVar9 = (float)local_d8;
      local_48 = SUB84(local_110,0) + fVar9 * (float)local_e8;
      fStack_44 = (float)((ulong)local_110 >> 0x20) + fVar9 * (float)((ulong)local_e8 >> 0x20);
      fStack_40 = fVar9 * 0.0 + 0.0;
      fStack_3c = fVar9 * 0.0 + 0.0;
      local_f0 = local_e0 * fVar9 + local_108;
      local_f8._4_4_ = fStack_44;
      local_f8._0_4_ = local_48;
      local_d8 = (double)CONCAT44(local_d8._4_4_,local_f0);
      if ((loss->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      local_68 = (*loss->_M_invoker)((_Any_data *)loss,(vec3f *)&local_f8);
      local_f8 = local_100 - local_68;
      if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_c8,
                   (iterator)
                   local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_f8);
      }
      else {
        *local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_f8;
        local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      local_110 = (double)CONCAT44(fStack_44,local_48);
      local_108 = (data_t)local_d8;
      local_100 = local_68;
    }
    if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start ==
        local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      bVar2 = true;
    }
    else {
      dVar1 = 0.0;
      pdVar5 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        dVar1 = dVar1 + *pdVar5;
        pdVar5 = pdVar5 + 1;
      } while (pdVar5 != local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      bVar2 = dVar1 < 1e-05;
    }
    local_d8 = local_110;
    uStack_d0 = 0;
    local_100 = (double)CONCAT44(local_100._4_4_,local_108);
    iVar6 = argmax<std::vector<double,std::allocator<double>>>(&local_c8);
    dVar3 = local_108;
    fVar10 = local_100._0_4_ - local_114;
    fVar11 = (data_t)local_d8 - (float)local_98._0_4_;
    fVar12 = local_d8._4_4_ - (float)local_98._4_4_;
    fVar9 = 1.0 / SQRT(fVar10 * fVar10 + fVar11 * fVar11 + fVar12 * fVar12);
    lVar7 = (long)iVar6._M_current -
            (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    local_60.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar7].x = fVar9 * fVar11;
    local_60.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar7].y = fVar9 * fVar12;
    local_60.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar7].z = fVar10 * fVar9;
    local_98._8_8_ = 0;
    local_98._0_8_ = local_110;
    local_114 = local_108;
    if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (double *)0x0) {
      operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  } while (!bVar2);
  if (local_60.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  vVar13.z = dVar3;
  vVar13.x = (data_t)local_98._0_4_;
  vVar13.y = (data_t)local_98._4_4_;
  return vVar13;
}

Assistant:

vec3f optimize(vec3f initial, std::function<double(vec3f)> loss)
{
	// Powell's method
	std::vector<vec3f> dir = {{1,0,0},{0,1,0},{0,0,1}};
	vec3f x0 = initial;
	double totalimprove = 0;
	while (true) {
		std::vector<double> improvement;
		vec3f x = x0;
		double f = loss(x0);
		for (auto d: dir) {
			double t = optimize(0, [&](double t){return loss(x+t*d);});
			vec3f x1 = x+t*d;
			double f1 = loss(x1);
			improvement.push_back(f - f1);
			x = x1;
			f = f1;
		}
		double improve = std::accumulate(improvement.begin(), improvement.end(), 0.0);
		// console.log("  improve",improve);
		totalimprove += improve;
		dir[argmax(improvement) - improvement.begin()] = normalized(x-x0);
		x0 = x;
		if (improve < 1e-5) break;
	}
	// console.log("total improve:", totalimprove);
	return x0;
}